

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathNodeSetAdd(xmlNodeSetPtr cur,xmlNodePtr val)

{
  uint uVar1;
  ulong uVar2;
  xmlNodePtr *ppxVar3;
  xmlNodePtr pxVar4;
  ulong uVar5;
  int iVar6;
  char *extra;
  xmlNsPtr ns;
  
  iVar6 = -1;
  if (val != (xmlNodePtr)0x0 && cur != (xmlNodeSetPtr)0x0) {
    uVar1 = cur->nodeNr;
    uVar5 = 0;
    uVar2 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    do {
      if (uVar5 == uVar2) {
        if (cur->nodeMax == 0) {
          ppxVar3 = (xmlNodePtr *)(*xmlMalloc)(0x50);
          cur->nodeTab = ppxVar3;
          if (ppxVar3 == (xmlNodePtr *)0x0) {
LAB_001cdb63:
            extra = "growing nodeset\n";
LAB_001cdb6a:
            xmlXPathErrMemory((xmlXPathContextPtr)0x0,extra);
            return -1;
          }
          ppxVar3[8] = (xmlNodePtr)0x0;
          ppxVar3[9] = (xmlNodePtr)0x0;
          ppxVar3[6] = (xmlNodePtr)0x0;
          ppxVar3[7] = (xmlNodePtr)0x0;
          ppxVar3[4] = (xmlNodePtr)0x0;
          ppxVar3[5] = (xmlNodePtr)0x0;
          ppxVar3[2] = (xmlNodePtr)0x0;
          ppxVar3[3] = (xmlNodePtr)0x0;
          *ppxVar3 = (xmlNodePtr)0x0;
          ppxVar3[1] = (xmlNodePtr)0x0;
          cur->nodeMax = 10;
        }
        else if (uVar1 == cur->nodeMax) {
          if (9999999 < (int)uVar1) {
            extra = "growing nodeset hit limit\n";
            goto LAB_001cdb6a;
          }
          ppxVar3 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(long)(int)uVar1 << 4);
          if (ppxVar3 == (xmlNodePtr *)0x0) goto LAB_001cdb63;
          cur->nodeMax = cur->nodeMax << 1;
          cur->nodeTab = ppxVar3;
        }
        if (val->type == XML_NAMESPACE_DECL) {
          pxVar4 = xmlXPathNodeSetDupNs((xmlNodePtr)val->_private,(xmlNsPtr)val);
          iVar6 = cur->nodeNr;
          cur->nodeNr = iVar6 + 1;
          cur->nodeTab[iVar6] = pxVar4;
        }
        else {
          iVar6 = cur->nodeNr;
          cur->nodeNr = iVar6 + 1;
          cur->nodeTab[iVar6] = val;
        }
        break;
      }
      ppxVar3 = cur->nodeTab + uVar2;
      uVar2 = uVar2 + 1;
    } while (*ppxVar3 != val);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int
xmlXPathNodeSetAdd(xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if ((cur == NULL) || (val == NULL)) return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * prevent duplicates
     */
    for (i = 0;i < cur->nodeNr;i++)
        if (cur->nodeTab[i] == val) return(0);

    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeMax == 0) {
        cur->nodeTab = (xmlNodePtr *) xmlMalloc(XML_NODESET_DEFAULT *
					     sizeof(xmlNodePtr));
	if (cur->nodeTab == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
	memset(cur->nodeTab, 0 ,
	       XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
        cur->nodeMax = XML_NODESET_DEFAULT;
    } else if (cur->nodeNr == cur->nodeMax) {
        xmlNodePtr *temp;

        if (cur->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
            xmlXPathErrMemory(NULL, "growing nodeset hit limit\n");
            return(-1);
        }
	temp = (xmlNodePtr *) xmlRealloc(cur->nodeTab, cur->nodeMax * 2 *
				      sizeof(xmlNodePtr));
	if (temp == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
        cur->nodeMax *= 2;
	cur->nodeTab = temp;
    }
    if (val->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) val;

        /* TODO: Check memory error. */
	cur->nodeTab[cur->nodeNr++] =
	    xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);
    } else
	cur->nodeTab[cur->nodeNr++] = val;
    return(0);
}